

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O2

void psh_hint_align(PSH_Hint_conflict hint,PSH_Globals globals,FT_Int dimension,PSH_Glyph glyph)

{
  FT_Bool FVar1;
  FT_Bool FVar2;
  PSH_Hint_conflict hint_00;
  FT_Int *pFVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  FT_UInt FVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  FT_Pos *pFVar16;
  FT_Pos FVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  FT_Int *pFVar21;
  bool bVar22;
  bool bVar23;
  ulong local_58;
  int local_50;
  long local_48;
  
  FVar12 = hint->flags;
  if ((FVar12 & 8) != 0) {
    return;
  }
  lVar19 = (long)(int)globals->dimension[(uint)dimension].scale_mult;
  iVar18 = hint->org_pos;
  uVar4 = (long)(int)((ulong)(iVar18 * lVar19 + 0x8000 + (iVar18 * lVar19 >> 0x3f)) >> 0x10) +
          globals->dimension[(uint)dimension].scale_delta;
  iVar11 = hint->org_len;
  uVar9 = iVar11 * lVar19 + 0x8000 + (iVar11 * lVar19 >> 0x3f);
  iVar8 = (int)(uVar9 >> 0x10);
  local_58 = (ulong)iVar8;
  if (dimension == 1) {
    if (glyph->do_vert_hints == '\0') {
LAB_00153a56:
      hint->cur_pos = uVar4;
      hint->cur_len = local_58;
      goto LAB_00153bbc;
    }
    FVar1 = glyph->do_vert_snapping;
    bVar23 = FVar1 != '\0';
    hint->cur_len = local_58;
    FVar2 = (globals->blues).no_overshoots;
    FVar12 = (globals->blues).normal_top.count;
    pFVar16 = &(globals->blues).normal_top.zones[0].cur_ref;
    iVar5 = 2;
    while (bVar22 = FVar12 != 0, FVar12 = FVar12 - 1, bVar22) {
      iVar20 = (iVar11 + iVar18) - *(FT_Int *)((long)pFVar16 + -4);
      iVar13 = (globals->blues).blue_fuzz;
      if (SBORROW4(iVar20,-iVar13) != iVar20 + iVar13 < 0) break;
      if (iVar11 + iVar18 <= iVar13 + *(int *)(pFVar16 + -1)) {
        if ((FVar2 != '\0') || (iVar20 <= (globals->blues).blue_threshold)) {
          local_48 = *pFVar16;
          iVar5 = 3;
          local_50 = 1;
          goto LAB_00153c0a;
        }
        break;
      }
      pFVar16 = pFVar16 + 6;
    }
    local_48 = 0;
    local_50 = 0;
LAB_00153c0a:
    uVar6 = (globals->blues).normal_bottom.count;
    iVar13 = uVar6 + 1;
    pFVar3 = &(globals->blues).normal_bottom.zones[(ulong)uVar6 - 1].org_top;
    do {
      pFVar21 = pFVar3;
      iVar13 = iVar13 + -1;
      if (iVar13 == 0) goto LAB_00153c92;
      iVar15 = *pFVar21 - iVar18;
      iVar20 = (globals->blues).blue_fuzz;
      if (SBORROW4(iVar15,-iVar20) != iVar15 + iVar20 < 0) goto LAB_00153c92;
      pFVar3 = pFVar21 + -0xc;
    } while (iVar18 < pFVar21[1] - iVar20);
    if ((FVar2 == '\0') && ((globals->blues).blue_threshold <= iVar15)) {
LAB_00153c92:
      FVar17 = 0;
    }
    else {
      FVar17 = *(FT_Pos *)(pFVar21 + 2);
      local_50 = iVar5;
    }
    if (local_50 == 1) {
      hint->cur_pos = local_48 - local_58;
      if (FVar1 == '\0') goto LAB_00153bb8;
      uVar4 = 0x40;
      if (0x3f < (long)local_58) {
        uVar4 = local_58 + 0x20 & 0x7fffffffffffffc0;
      }
      hint->cur_pos = local_48 - uVar4;
    }
    else if (local_50 == 3) {
      hint->cur_pos = FVar17;
      uVar4 = local_48 - FVar17;
    }
    else {
      if (local_50 != 2) goto LAB_0015398a;
      hint->cur_pos = FVar17;
      if (FVar1 == '\0') goto LAB_00153bb8;
      uVar4 = 0x40;
      if (0x3f < (long)local_58) {
        uVar4 = local_58 + 0x20 & 0x7fffffffffffffc0;
      }
    }
LAB_00153bb4:
    hint->cur_len = uVar4;
  }
  else {
    if (dimension == 0) {
      if (glyph->do_horz_hints == '\0') goto LAB_00153a56;
      bVar23 = glyph->do_horz_snapping != '\0';
    }
    else {
      bVar23 = false;
    }
    hint->cur_len = local_58;
LAB_0015398a:
    hint_00 = hint->parent;
    if (hint_00 != (PSH_Hint_conflict)0x0) {
      if ((hint_00->flags & 8) == 0) {
        psh_hint_align(hint_00,globals,dimension,glyph);
        iVar18 = hint->org_pos;
        iVar11 = hint->org_len;
      }
      lVar19 = lVar19 * ((iVar18 - ((hint_00->org_len >> 1) + hint_00->org_pos)) + (iVar11 >> 1));
      uVar4 = (hint_00->cur_pos - ((long)((uVar9 >> 0x10) << 0x20) >> 0x21)) +
              (hint_00->cur_len >> 1) +
              (long)(int)((ulong)((lVar19 >> 0x3f) + lVar19 + 0x8000) >> 0x10);
    }
    uVar9 = uVar4;
    if (glyph->do_stem_adjust != '\0') {
      if (iVar8 < 0x41) {
        if (iVar8 < 0x20) {
          uVar7 = uVar4 + 0x20 & 0xffffffffffffffc0;
          uVar9 = uVar7;
          if (0 < iVar8) {
            uVar10 = uVar7 - uVar4;
            uVar9 = uVar4 + local_58 + 0x20 & 0xffffffffffffffc0;
            uVar14 = uVar9 - (uVar4 + local_58);
            uVar4 = -uVar10;
            if (0 < (long)uVar10) {
              uVar4 = uVar10;
            }
            uVar10 = -uVar14;
            if (0 < (long)uVar14) {
              uVar10 = uVar14;
            }
            if (uVar4 <= uVar10) {
              uVar9 = uVar7;
            }
          }
        }
        else {
          uVar9 = uVar4 + (local_58 >> 1) & 0xffffffffffffffc0;
          local_58 = 0x40;
        }
      }
      else {
        uVar4 = globals->dimension[(uint)dimension].stdw.widths[0].cur;
        uVar10 = local_58 - uVar4;
        uVar7 = -uVar10;
        if (0 < (long)uVar10) {
          uVar7 = uVar10;
        }
        uVar10 = 0x30;
        if (0x30 < (long)uVar4) {
          uVar10 = uVar4;
        }
        if (uVar7 < 0x28) {
          local_58 = uVar10;
        }
        if ((long)local_58 < 0xc0) {
          uVar6 = (uint)local_58 & 0x3f;
          if (9 < uVar6) {
            if (uVar6 < 0x20) {
              local_58 = local_58 & 0x7fffffffffffffc0 | 10;
            }
            else if (uVar6 < 0x36) {
              local_58 = local_58 & 0x7fffffffffffffc0 | 0x36;
            }
          }
        }
        else {
          local_58 = local_58 + 0x20 & 0x7fffffffffffffc0;
        }
      }
    }
    uVar10 = (uVar9 + 0x20 & 0xffffffffffffffc0) - uVar9;
    uVar4 = ((uVar9 + 0x20 + local_58 & 0xffffffffffffffc0) - uVar9) - local_58;
    uVar7 = -uVar10;
    if (0 < (long)uVar10) {
      uVar7 = uVar10;
    }
    uVar14 = -uVar4;
    if (0 < (long)uVar4) {
      uVar14 = uVar4;
    }
    if (uVar7 <= uVar14) {
      uVar4 = uVar10;
    }
    lVar19 = uVar4 + uVar9;
    hint->cur_pos = lVar19;
    hint->cur_len = local_58;
    if (bVar23) {
      uVar4 = 0x40;
      if (0x3f < (long)local_58) {
        uVar4 = local_58 + 0x20 & 0x7fffffffffffffc0;
      }
      uVar9 = uVar4 >> 1;
      if ((uVar4 & 0x40) == 0) {
        uVar7 = lVar19 + uVar9 + 0x20 & 0xffffffffffffffc0;
      }
      else {
        uVar7 = lVar19 + uVar9 & 0xffffffffffffffc0 | 0x20;
      }
      hint->cur_pos = uVar7 - uVar9;
      goto LAB_00153bb4;
    }
  }
LAB_00153bb8:
  FVar12 = hint->flags;
LAB_00153bbc:
  hint->flags = FVar12 | 8;
  return;
}

Assistant:

static void
  psh_hint_align( PSH_Hint     hint,
                  PSH_Globals  globals,
                  FT_Int       dimension,
                  PSH_Glyph    glyph )
  {
    PSH_Dimension  dim   = &globals->dimension[dimension];
    FT_Fixed       scale = dim->scale_mult;
    FT_Fixed       delta = dim->scale_delta;


    if ( !psh_hint_is_fitted( hint ) )
    {
      FT_Pos  pos = FT_MulFix( hint->org_pos, scale ) + delta;
      FT_Pos  len = FT_MulFix( hint->org_len, scale );

      FT_Int            do_snapping;
      FT_Pos            fit_len;
      PSH_AlignmentRec  align;


      /* ignore stem alignments when requested through the hint flags */
      if ( ( dimension == 0 && !glyph->do_horz_hints ) ||
           ( dimension == 1 && !glyph->do_vert_hints ) )
      {
        hint->cur_pos = pos;
        hint->cur_len = len;

        psh_hint_set_fitted( hint );
        return;
      }

      /* perform stem snapping when requested - this is necessary
       * for monochrome and LCD hinting modes only
       */
      do_snapping = ( dimension == 0 && glyph->do_horz_snapping ) ||
                    ( dimension == 1 && glyph->do_vert_snapping );

      hint->cur_len = fit_len = len;

      /* check blue zones for horizontal stems */
      align.align     = PSH_BLUE_ALIGN_NONE;
      align.align_bot = align.align_top = 0;

      if ( dimension == 1 )
        psh_blues_snap_stem( &globals->blues,
                             hint->org_pos + hint->org_len,
                             hint->org_pos,
                             &align );

      switch ( align.align )
      {
      case PSH_BLUE_ALIGN_TOP:
        /* the top of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_top - fit_len;
        break;

      case PSH_BLUE_ALIGN_BOT:
        /* the bottom of the stem is aligned against a blue zone */
        hint->cur_pos = align.align_bot;
        break;

      case PSH_BLUE_ALIGN_TOP | PSH_BLUE_ALIGN_BOT:
        /* both edges of the stem are aligned against blue zones */
        hint->cur_pos = align.align_bot;
        hint->cur_len = align.align_top - align.align_bot;
        break;

      default:
        {
          PSH_Hint  parent = hint->parent;


          if ( parent )
          {
            FT_Pos  par_org_center, par_cur_center;
            FT_Pos  cur_org_center, cur_delta;


            /* ensure that parent is already fitted */
            if ( !psh_hint_is_fitted( parent ) )
              psh_hint_align( parent, globals, dimension, glyph );

            /* keep original relation between hints, this is, use the */
            /* scaled distance between the centers of the hints to    */
            /* compute the new position                               */
            par_org_center = parent->org_pos + ( parent->org_len >> 1 );
            par_cur_center = parent->cur_pos + ( parent->cur_len >> 1 );
            cur_org_center = hint->org_pos   + ( hint->org_len   >> 1 );

            cur_delta = FT_MulFix( cur_org_center - par_org_center, scale );
            pos       = par_cur_center + cur_delta - ( len >> 1 );
          }

          hint->cur_pos = pos;
          hint->cur_len = fit_len;

          /* Stem adjustment tries to snap stem widths to standard
           * ones.  This is important to prevent unpleasant rounding
           * artefacts.
           */
          if ( glyph->do_stem_adjust )
          {
            if ( len <= 64 )
            {
              /* the stem is less than one pixel; we will center it
               * around the nearest pixel center
               */
              if ( len >= 32 )
              {
                /* This is a special case where we also widen the stem
                 * and align it to the pixel grid.
                 *
                 *   stem_center          = pos + (len/2)
                 *   nearest_pixel_center = FT_ROUND(stem_center-32)+32
                 *   new_pos              = nearest_pixel_center-32
                 *                        = FT_ROUND(stem_center-32)
                 *                        = FT_FLOOR(stem_center-32+32)
                 *                        = FT_FLOOR(stem_center)
                 *   new_len              = 64
                 */
                pos = FT_PIX_FLOOR( pos + ( len >> 1 ) );
                len = 64;
              }
              else if ( len > 0 )
              {
                /* This is a very small stem; we simply align it to the
                 * pixel grid, trying to find the minimum displacement.
                 *
                 * left               = pos
                 * right              = pos + len
                 * left_nearest_edge  = ROUND(pos)
                 * right_nearest_edge = ROUND(right)
                 *
                 * if ( ABS(left_nearest_edge - left) <=
                 *      ABS(right_nearest_edge - right) )
                 *    new_pos = left
                 * else
                 *    new_pos = right
                 */
                FT_Pos  left_nearest  = FT_PIX_ROUND( pos );
                FT_Pos  right_nearest = FT_PIX_ROUND( pos + len );
                FT_Pos  left_disp     = left_nearest - pos;
                FT_Pos  right_disp    = right_nearest - ( pos + len );


                if ( left_disp < 0 )
                  left_disp = -left_disp;
                if ( right_disp < 0 )
                  right_disp = -right_disp;
                if ( left_disp <= right_disp )
                  pos = left_nearest;
                else
                  pos = right_nearest;
              }
              else
              {
                /* this is a ghost stem; we simply round it */
                pos = FT_PIX_ROUND( pos );
              }
            }
            else
            {
              len = psh_dimension_quantize_len( dim, len, 0 );
            }
          }

          /* now that we have a good hinted stem width, try to position */
          /* the stem along a pixel grid integer coordinate             */
          hint->cur_pos = pos + psh_hint_snap_stem_side_delta( pos, len );
          hint->cur_len = len;
        }
      }

      if ( do_snapping )
      {
        pos = hint->cur_pos;
        len = hint->cur_len;

        if ( len < 64 )
          len = 64;
        else
          len = FT_PIX_ROUND( len );

        switch ( align.align )
        {
          case PSH_BLUE_ALIGN_TOP:
            hint->cur_pos = align.align_top - len;
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT:
            hint->cur_len = len;
            break;

          case PSH_BLUE_ALIGN_BOT | PSH_BLUE_ALIGN_TOP:
            /* don't touch */
            break;


          default:
            hint->cur_len = len;
            if ( len & 64 )
              pos = FT_PIX_FLOOR( pos + ( len >> 1 ) ) + 32;
            else
              pos = FT_PIX_ROUND( pos + ( len >> 1 ) );

            hint->cur_pos = pos - ( len >> 1 );
            hint->cur_len = len;
        }
      }

      psh_hint_set_fitted( hint );

#ifdef DEBUG_HINTER
      if ( ps_debug_hint_func )
        ps_debug_hint_func( hint, dimension );
#endif
    }
  }